

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_column_data.cpp
# Opt level: O1

void __thiscall duckdb::ListColumnData::RevertAppend(ListColumnData *this,row_t start_row)

{
  int iVar1;
  undefined4 extraout_var;
  uint64_t uVar2;
  pointer pCVar3;
  undefined8 extraout_RDX;
  
  ColumnData::RevertAppend(&this->super_ColumnData,start_row);
  ColumnData::RevertAppend(&(this->validity).super_ColumnData,start_row);
  iVar1 = (*(this->super_ColumnData)._vptr_ColumnData[3])(this);
  if ((this->super_ColumnData).start < CONCAT44(extraout_var,iVar1)) {
    uVar2 = FetchListOffset(this,CONCAT44(extraout_var,iVar1) - 1);
    pCVar3 = unique_ptr<duckdb::ColumnData,_std::default_delete<duckdb::ColumnData>,_true>::
             operator->(&this->child_column);
    (*pCVar3->_vptr_ColumnData[0x14])(pCVar3,uVar2,extraout_RDX,pCVar3->_vptr_ColumnData[0x14]);
    return;
  }
  return;
}

Assistant:

void ListColumnData::RevertAppend(row_t start_row) {
	ColumnData::RevertAppend(start_row);
	validity.RevertAppend(start_row);
	auto column_count = GetMaxEntry();
	if (column_count > start) {
		// revert append in the child column
		auto list_offset = FetchListOffset(column_count - 1);
		child_column->RevertAppend(UnsafeNumericCast<row_t>(list_offset));
	}
}